

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O1

void swap_buf(void *buf,int32 el_sz,int32 n_el)

{
  ushort *puVar1;
  uint uVar2;
  ulong uVar3;
  
  if (el_sz != 1) {
    if (el_sz == 2) {
      if (0 < n_el) {
        uVar3 = 0;
        do {
          puVar1 = (ushort *)((long)buf + uVar3 * 2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          uVar3 = uVar3 + 1;
        } while ((uint)n_el != uVar3);
      }
    }
    else {
      if (el_sz != 4) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                ,0x13f,"Unsupported elemsize for byteswapping: %d\n");
        exit(1);
      }
      if (0 < n_el) {
        uVar3 = 0;
        do {
          uVar2 = *(uint *)((long)buf + uVar3 * 4);
          *(uint *)((long)buf + uVar3 * 4) =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          uVar3 = uVar3 + 1;
        } while ((uint)n_el != uVar3);
      }
    }
  }
  return;
}

Assistant:

static void
swap_buf(void *buf, int32 el_sz, int32 n_el)
{
    int32 i;
    uint16 *buf16;
    uint32 *buf32;

    switch (el_sz) {
    case 1:
        break;
    case 2:
        buf16 = (uint16 *) buf;
        for (i = 0; i < n_el; i++)
            SWAP_INT16(buf16 + i);
        break;
    case 4:
        buf32 = (uint32 *) buf;
        for (i = 0; i < n_el; i++)
            SWAP_INT32(buf32 + i);
        break;
    default:
        E_FATAL("Unsupported elemsize for byteswapping: %d\n", el_sz);
        break;
    }
}